

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

dropt_char ** dropt_parse(dropt_context *context,int argc,dropt_char **argv)

{
  char *pcVar1;
  size_t sVar2;
  size_t numElements;
  char *__s;
  _Bool _Var3;
  int iVar4;
  dropt_error dVar5;
  option_proxy *poVar6;
  char *pcVar7;
  undefined8 *puVar8;
  dropt_context **ppdVar9;
  char shortName;
  dropt_char **ppdVar10;
  dropt_option *pdVar11;
  size_t sVar12;
  size_t sVar13;
  dropt_option *pdVar14;
  size_t sVar15;
  dropt_char *pdVar16;
  char_array optionName;
  parse_state local_78;
  char *local_50;
  long local_48;
  dropt_option *local_40;
  dropt_context *local_38;
  
  local_78.option = (dropt_option *)0x0;
  local_78.optionArgument = (char *)0x0;
  local_78.argNext = argv;
  if (argv != (dropt_char **)0x0) {
    if (context == (dropt_context *)0x0) {
      dropt_parse_cold_1();
LAB_00102ee3:
      __assert_fail("context->ncmpstr != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                    ,0x1ee,
                    "const dropt_option *find_option_short(const dropt_context *, dropt_char)");
    }
    if (argc == -1) {
      argc = -1;
      ppdVar10 = argv;
      do {
        argc = argc + 1;
        pdVar16 = *ppdVar10;
        ppdVar10 = ppdVar10 + 1;
      } while (pdVar16 != (dropt_char *)0x0);
    }
    if (argc != 0) {
      pdVar14 = context->options;
      numElements = context->numOptions;
      if (context->sortedByLong == (option_proxy *)0x0) {
        poVar6 = (option_proxy *)dropt_safe_malloc(numElements,0x10);
        context->sortedByLong = poVar6;
        if (poVar6 != (option_proxy *)0x0) {
          if (numElements != 0) {
            ppdVar9 = &poVar6->context;
            pdVar11 = pdVar14;
            sVar13 = numElements;
            do {
              ((option_proxy *)(ppdVar9 + -1))->option = pdVar11;
              *ppdVar9 = context;
              ppdVar9 = ppdVar9 + 2;
              pdVar11 = pdVar11 + 1;
              sVar13 = sVar13 - 1;
            } while (sVar13 != 0);
          }
          qsort(poVar6,numElements,0x10,cmp_option_proxies_long);
        }
      }
      local_78.argsLeft = argc;
      if (context->sortedByShort == (option_proxy *)0x0) {
        poVar6 = (option_proxy *)dropt_safe_malloc(numElements,0x10);
        context->sortedByShort = poVar6;
        if (poVar6 != (option_proxy *)0x0) {
          if (numElements != 0) {
            ppdVar9 = &poVar6->context;
            sVar13 = numElements;
            do {
              ((option_proxy *)(ppdVar9 + -1))->option = pdVar14;
              *ppdVar9 = context;
              ppdVar9 = ppdVar9 + 2;
              pdVar14 = pdVar14 + 1;
              sVar13 = sVar13 - 1;
            } while (sVar13 != 0);
          }
          qsort(poVar6,numElements,0x10,cmp_option_proxies_short);
        }
      }
      while (0 < local_78.argsLeft) {
        local_78.argsLeft = local_78.argsLeft + -1;
        __s = *local_78.argNext;
        if (__s == (char *)0x0) {
          return local_78.argNext;
        }
        if (*__s != '-') {
          return local_78.argNext;
        }
        if (__s[1] == '\0') {
          return local_78.argNext;
        }
        local_78.argNext = local_78.argNext + 1;
        if (__s[1] == '-') {
          if (__s[2] == '\0') {
            return local_78.argNext;
          }
          pcVar1 = __s + 2;
          pcVar7 = strchr(pcVar1,0x3d);
          if (pcVar7 == pcVar1) goto LAB_00102e64;
          if (pcVar7 == (char *)0x0) {
            sVar15 = strlen(pcVar1);
            pcVar7 = pcVar1 + sVar15;
          }
          else {
            local_78.optionArgument = pcVar7 + 1;
          }
          local_48 = (long)pcVar7 - (long)pcVar1;
          local_50 = pcVar1;
          if (context->sortedByLong == (option_proxy *)0x0) {
            local_40 = context->options;
            local_38 = context;
            while (_Var3 = is_valid_option(local_40), _Var3) {
              iVar4 = cmp_key_option_proxy_long(&local_50,&local_40);
              pdVar14 = local_40;
              if (iVar4 == 0) goto LAB_00102db9;
              local_40 = local_40 + 1;
            }
            pdVar14 = (dropt_option *)0x0;
LAB_00102db9:
            local_78.option = pdVar14;
            if (pdVar14 != (dropt_option *)0x0) {
              dVar5 = parse_option_arg(context,&local_78);
              if (dVar5 != 0) {
                sVar15 = (long)pcVar7 - (long)__s;
                pdVar16 = local_78.optionArgument;
                goto LAB_00102ec4;
              }
              if (((local_78.option)->attr & 1) != 0) {
                return local_78.argNext;
              }
              goto LAB_00102de3;
            }
          }
          else {
            puVar8 = (undefined8 *)
                     bsearch(&local_50,context->sortedByLong,context->numOptions,0x10,
                             cmp_key_option_proxy_long);
            if (puVar8 != (undefined8 *)0x0) {
              pdVar14 = (dropt_option *)*puVar8;
              goto LAB_00102db9;
            }
          }
          sVar15 = (long)pcVar7 - (long)__s;
LAB_00102e8d:
          dVar5 = 4;
          pdVar16 = (dropt_char *)0x0;
LAB_00102ec4:
          optionName.len = sVar15;
          optionName.s = __s;
          set_error_details(context,dVar5,optionName,pdVar16);
          return local_78.argNext;
        }
        pcVar1 = __s + 1;
        pcVar7 = strchr(pcVar1,0x3d);
        sVar15 = (long)pcVar7 - (long)pcVar1;
        if (sVar15 == 0) {
LAB_00102e64:
          sVar15 = strlen(__s);
          goto LAB_00102e8d;
        }
        if (pcVar7 == (char *)0x0) {
          sVar15 = strlen(pcVar1);
        }
        else {
          local_78.optionArgument = pcVar7 + 1;
        }
        sVar12 = 0;
        while (sVar12 != sVar15) {
          local_50 = (char *)CONCAT71(local_50._1_7_,pcVar1[sVar12]);
          if (pcVar1[sVar12] == '\0') {
            __assert_fail("shortName != DROPT_TEXT_LITERAL(\'\\0\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                          ,0x1ed,
                          "const dropt_option *find_option_short(const dropt_context *, dropt_char)"
                         );
          }
          if (context->ncmpstr == (dropt_strncmp_func)0x0) goto LAB_00102ee3;
          if (context->sortedByShort != (option_proxy *)0x0) {
            puVar8 = (undefined8 *)
                     bsearch(&local_50,context->sortedByShort,context->numOptions,0x10,
                             cmp_key_option_proxy_short);
            if (puVar8 != (undefined8 *)0x0) {
              pdVar14 = (dropt_option *)*puVar8;
              goto LAB_00102c84;
            }
LAB_00102e3b:
            shortName = pcVar1[sVar12];
            dVar5 = 4;
LAB_00102e49:
            pdVar16 = (dropt_char *)0x0;
LAB_00102e4b:
            set_short_option_error_details(context,dVar5,shortName,pdVar16);
            return local_78.argNext;
          }
          pdVar14 = context->options;
          while( true ) {
            _Var3 = is_valid_option(pdVar14);
            if (!_Var3) goto LAB_00102e3b;
            iVar4 = (*context->ncmpstr)((dropt_char *)&local_50,&pdVar14->short_name,1);
            if (iVar4 == 0) break;
            pdVar14 = pdVar14 + 1;
          }
LAB_00102c84:
          local_78.option = pdVar14;
          if (pdVar14 == (dropt_option *)0x0) goto LAB_00102e3b;
          sVar2 = sVar12 + 1;
          if (sVar2 != sVar15) {
            if (((context->allowConcatenatedArgs != true) || (sVar12 != 0)) ||
               (pdVar14->arg_description == (dropt_char *)0x0)) {
              if ((pdVar14->arg_description == (dropt_char *)0x0) || ((pdVar14->attr & 4) != 0)) {
                dVar5 = set_option_value(context,pdVar14,(dropt_char *)0x0);
                if (dVar5 == 0) goto LAB_00102ceb;
                shortName = pcVar1[sVar12];
              }
              else {
                shortName = pcVar1[sVar12];
                dVar5 = 5;
              }
              goto LAB_00102e49;
            }
            pdVar16 = pcVar1 + sVar2;
            dVar5 = set_option_value(context,pdVar14,pdVar16);
            if ((dVar5 != 0) &&
               ((((local_78.option)->attr & 4) == 0 ||
                (dVar5 = set_option_value(context,local_78.option,(dropt_char *)0x0), dVar5 != 0))))
            {
              shortName = *pcVar1;
              goto LAB_00102e4b;
            }
            break;
          }
          dVar5 = parse_option_arg(context,&local_78);
          if (dVar5 != 0) {
            shortName = pcVar1[sVar12];
            pdVar16 = local_78.optionArgument;
            goto LAB_00102e4b;
          }
LAB_00102ceb:
          sVar12 = sVar2;
          if (((local_78.option)->attr & 1) != 0) {
            return local_78.argNext;
          }
        }
LAB_00102de3:
        local_78.option = (dropt_option *)0x0;
        local_78.optionArgument = (char *)0x0;
      }
    }
  }
  return local_78.argNext;
}

Assistant:

dropt_char**
dropt_parse(dropt_context* context,
            int argc, dropt_char** argv)
{
    dropt_char* arg;
    parse_state ps;

    ps.option = NULL;
    ps.optionArgument = NULL;
    ps.argNext = argv;

    if (argv == NULL)
    {
        /* Nothing to do. */
        goto exit;
    }

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }

#ifdef DROPT_NO_STRING_BUFFERS
    if (context->errorHandler == NULL)
    {
        DROPT_MISUSE("No error handler specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }
#endif

    if (argc == -1)
    {
        argc = 0;
        while (argv[argc] != NULL) { argc++; }
    }

    if (argc == 0)
    {
        /* Nothing to do. */
        goto exit;
    }

    init_lookup_tables(context);

    ps.argsLeft = argc;

    while (   ps.argsLeft-- > 0
           && (arg = *ps.argNext) != NULL
           && arg[0] == DROPT_TEXT_LITERAL('-'))
    {
        if (arg[1] == DROPT_TEXT_LITERAL('\0'))
        {
            /* - */

            /* This intentionally leaves "-" unprocessed for the caller to
             * deal with.  This allows construction of programs that treat
             * "-" to mean `stdin`.
             */
            goto exit;
        }

        ps.argNext++;

        if (arg[1] == DROPT_TEXT_LITERAL('-'))
        {
            if (!parse_long_option(context, &ps, arg)) { goto exit; }
        }
        else
        {
            /* Short name. (-x) */
            if (!parse_short_option(context, &ps, arg)) { goto exit; }
        }

        ps.option = NULL;
        ps.optionArgument = NULL;
    }

exit:
    return ps.argNext;
}